

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<double>
          (BasicWriter<wchar_t> *this,double value,FormatSpec *spec)

{
  Alignment AVar1;
  wchar_t fill;
  uint uVar2;
  CharPtr pwVar3;
  uint uVar4;
  wchar_t wVar5;
  long lVar6;
  byte code;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 *puVar10;
  int precision;
  wchar_t *pwVar11;
  byte bVar12;
  bool bVar13;
  wchar_t format [10];
  
  code = spec->type_;
  uVar4 = code - 0x41;
  if (uVar4 < 0x27) {
    if ((0x71UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_0012947e;
      goto LAB_0012919e;
    }
    bVar13 = true;
  }
  else {
LAB_0012947e:
    if (code != 0) {
      internal::report_unknown_type(code,"double");
    }
    code = 0x67;
LAB_0012919e:
    bVar13 = false;
  }
  if (0.0 <= value) {
    if ((spec->flags_ & 1) == 0) {
      bVar12 = 0;
    }
    else {
      bVar12 = 0x2b;
      if ((spec->flags_ & 2) == 0) {
        bVar12 = 0x20;
      }
    }
  }
  else {
    value = -value;
    bVar12 = 0x2d;
  }
  if (NAN(value)) {
    pcVar9 = " nan";
    if (bVar13) {
      pcVar9 = " NAN";
    }
    pcVar7 = " nan";
    if (bVar13) {
      pcVar7 = " NAN";
    }
    pcVar7 = pcVar7 + 1;
    if (bVar12 != 0) {
      pcVar7 = pcVar9;
    }
    uVar8 = (ulong)(bVar12 != 0);
LAB_0012922f:
    pwVar3 = write_str<char>(this,pcVar7,uVar8 + 3,&spec->super_AlignSpec);
    if (bVar12 != 0) {
      *pwVar3 = (uint)bVar12;
    }
    return;
  }
  if (ABS(value) == INFINITY) {
    pcVar9 = " inf";
    if (bVar13) {
      pcVar9 = " INF";
    }
    pcVar7 = " inf";
    if (bVar13) {
      pcVar7 = " INF";
    }
    uVar8 = (ulong)(bVar12 != 0);
    pcVar7 = pcVar7 + 1;
    if (bVar12 != 0) {
      pcVar7 = pcVar9;
    }
    goto LAB_0012922f;
  }
  puVar10 = *(undefined8 **)(this + 8);
  lVar6 = puVar10[2];
  uVar4 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (bVar12 != 0) {
    if ((ulong)puVar10[3] < (ulong)(uVar4 + (uVar4 == 0)) + lVar6) {
      (**(code **)*puVar10)();
    }
    bVar13 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar13) {
      uVar4 = 0;
    }
    lVar6 = lVar6 + 1;
  }
  format[0] = L'%';
  if ((spec->flags_ & 8) == 0) {
    pwVar11 = format + 1;
  }
  else {
    pwVar11 = format + 2;
    format[1] = L'#';
  }
  AVar1 = (spec->super_AlignSpec).align_;
  if (AVar1 != ALIGN_CENTER) {
    if (AVar1 == ALIGN_LEFT) {
      *pwVar11 = L'-';
      pwVar11 = pwVar11 + 1;
    }
    if (uVar4 != 0) {
      *pwVar11 = L'*';
      pwVar11 = pwVar11 + 1;
      goto LAB_001292f5;
    }
  }
  uVar4 = 0;
LAB_001292f5:
  precision = spec->precision_;
  if (-1 < precision) {
    pwVar11[0] = L'.';
    pwVar11[1] = L'*';
    pwVar11 = pwVar11 + 2;
  }
  *pwVar11 = (uint)code;
  pwVar11[1] = L'\0';
  fill = (spec->super_AlignSpec).super_WidthSpec.fill_;
  do {
    pwVar11 = (wchar_t *)(*(long *)(*(long *)(this + 8) + 8) + lVar6 * 4);
    uVar2 = internal::CharTraits<wchar_t>::format_float<double>
                      (pwVar11,*(long *)(*(long *)(this + 8) + 0x18) - lVar6,format,uVar4,precision,
                       value);
    if ((int)uVar2 < 0) {
      puVar10 = *(undefined8 **)(this + 8);
      if (puVar10[3] != -1) {
        uVar8 = puVar10[3] + 1;
        goto LAB_00129394;
      }
    }
    else {
      puVar10 = *(undefined8 **)(this + 8);
      if ((ulong)uVar2 + lVar6 < (ulong)puVar10[3]) {
        AVar1 = (spec->super_AlignSpec).align_;
        if (bVar12 == 0) {
          bVar12 = 0;
        }
        else {
          if (((AVar1 != ALIGN_RIGHT) && (AVar1 != ALIGN_DEFAULT)) ||
             (wVar5 = fill, *pwVar11 != L' ')) {
            wVar5 = (wchar_t)bVar12;
            bVar12 = 0;
          }
          pwVar11[-1] = wVar5;
          uVar2 = uVar2 + 1;
        }
        if (AVar1 == ALIGN_CENTER) {
          uVar4 = (spec->super_AlignSpec).super_WidthSpec.width_;
          if (uVar2 < uVar4) {
            pwVar3 = grow_buffer(this,(ulong)uVar4);
            memmove(pwVar3 + (uVar4 - uVar2 >> 1),pwVar3,(ulong)uVar2 * 4);
            fill_padding(pwVar3,(spec->super_AlignSpec).super_WidthSpec.width_,(ulong)uVar2,fill);
            return;
          }
        }
        if ((bVar12 != 0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
          for (; *pwVar11 == L' '; pwVar11 = pwVar11 + 1) {
            *pwVar11 = fill;
          }
          if (bVar12 != 0) {
            pwVar11[-1] = (uint)bVar12;
          }
        }
        grow_buffer(this,(ulong)uVar2);
        return;
      }
      uVar8 = (ulong)uVar2 + lVar6 + 1;
      if ((ulong)puVar10[3] < uVar8) {
LAB_00129394:
        (**(code **)*puVar10)(puVar10,uVar8);
      }
    }
    precision = spec->precision_;
  } while( true );
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}